

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.cpp
# Opt level: O2

Spectrum * __thiscall
phyr::BSDF::rho(Spectrum *__return_storage_ptr__,BSDF *this,int nSamples,Point2f *samples1,
               Point2f *samples2,BxDFType flags)

{
  BxDF *pBVar1;
  int i;
  long lVar2;
  CoefficientSpectrum<60> local_210;
  
  CoefficientSpectrum<60>::CoefficientSpectrum
            (&__return_storage_ptr__->super_CoefficientSpectrum<60>,0.0);
  for (lVar2 = 0; lVar2 < this->nBxDFs; lVar2 = lVar2 + 1) {
    pBVar1 = this->bxdfs[lVar2];
    if ((pBVar1->type & ~flags) == 0) {
      (*pBVar1->_vptr_BxDF[5])(&local_210,pBVar1,(ulong)(uint)nSamples,samples1,samples2);
      CoefficientSpectrum<60>::operator+=
                (&__return_storage_ptr__->super_CoefficientSpectrum<60>,&local_210);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Spectrum BSDF::rho(int nSamples, const Point2f* samples1,
                   const Point2f* samples2, BxDFType flags) const {
    Spectrum ret(0.f);
    for (int i = 0; i < nBxDFs; ++i)
        if (bxdfs[i]->matchesFlags(flags))
            ret += bxdfs[i]->rho(nSamples, samples1, samples2);
    return ret;
}